

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ResolveFeaturesImpl<google::protobuf::Descriptor>
          (DescriptorBuilder *this,Edition edition,Proto *proto,Descriptor *descriptor,
          OptionsType *options,FlatAllocator *alloc,ErrorLocation error_location,bool force_merge)

{
  Tables *pTVar1;
  ushort *puVar2;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  bool bVar3;
  FeatureSet **ppFVar4;
  FeatureSet *pFVar5;
  size_t sVar6;
  FeatureSet *pFVar7;
  string_view element_name;
  string_view element_name_00;
  StatusOr<google::protobuf::FeatureSet> merged;
  FeatureSet base_features;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1 *local_e0;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1 local_d8;
  FeatureSet local_d0;
  FeatureSet local_80;
  
  if (descriptor->containing_type_ == (Descriptor *)0x0) {
    ppFVar4 = &descriptor->file_->merged_features_;
  }
  else {
    ppFVar4 = &descriptor->containing_type_->merged_features_;
  }
  pFVar7 = *ppFVar4;
  descriptor->proto_features_ = (FeatureSet *)_FeatureSet_default_instance_;
  descriptor->merged_features_ = (FeatureSet *)_FeatureSet_default_instance_;
  if ((this->feature_resolver_).
      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>._M_payload.
      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::FeatureResolver>._M_engaged != false) {
    bVar3 = MessageOptions::has_features(options);
    if (bVar3) {
      pTVar1 = this->tables_;
      pFVar5 = MessageOptions::mutable_features(options);
      pFVar5 = DescriptorPool::Tables::InternFeatureSet(pTVar1,pFVar5);
      descriptor->proto_features_ = pFVar5;
      MessageOptions::clear_features(options);
    }
    FeatureSet::FeatureSet(&local_80,descriptor->proto_features_);
    if (((int)edition < 1000) &&
       (descriptor->proto_features_ != (FeatureSet *)_FeatureSet_default_instance_)) {
      puVar2 = (ushort *)(descriptor->all_names_).payload_;
      element_name._M_len = (ulong)*puVar2;
      element_name._M_str = (char *)((long)puVar2 + ~element_name._M_len);
      AddError(this,element_name,&proto->super_Message,error_location,
               "Features are only valid under editions.");
    }
    sVar6 = FeatureSet::ByteSizeLong(&local_80);
    if (sVar6 == 0 && !force_merge) {
      descriptor->merged_features_ = pFVar7;
    }
    else {
      FeatureResolver::MergeFeatures
                ((StatusOr<google::protobuf::FeatureSet> *)&local_d8.status_,
                 (FeatureResolver *)&this->feature_resolver_,pFVar7,&local_80);
      if (local_d8 == (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1)0x1)
      {
        pTVar1 = this->tables_;
        absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSet>::EnsureOk
                  ((StatusOrData<google::protobuf::FeatureSet> *)&local_d8.status_);
        pFVar7 = DescriptorPool::Tables::InternFeatureSet(pTVar1,&local_d0);
        descriptor->merged_features_ = pFVar7;
      }
      else {
        puVar2 = (ushort *)(descriptor->all_names_).payload_;
        element_name_00._M_len = (ulong)*puVar2;
        element_name_00._M_str = (char *)((long)puVar2 + ~element_name_00._M_len);
        make_error.invoker_ =
             absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::ResolveFeaturesImpl<google::protobuf::Descriptor>(google::protobuf::Edition,google::protobuf::Descriptor::Proto_const&,google::protobuf::Descriptor*,google::protobuf::Descriptor::OptionsType*,google::protobuf::internal::FlatAllocator&,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation,bool)::_lambda()_1_,std::__cxx11::string>
        ;
        make_error.ptr_.obj = &local_e0;
        local_e0 = &local_d8;
        AddError(this,element_name_00,&proto->super_Message,error_location,make_error);
      }
      absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSet>::
      ~StatusOrData((StatusOrData<google::protobuf::FeatureSet> *)&local_d8.status_);
    }
    FeatureSet::~FeatureSet(&local_80);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_d8.status_,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
             ,0x170a,"feature_resolver_.has_value()");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
            ((LogMessageFatal *)&local_d8.status_);
}

Assistant:

void DescriptorBuilder::ResolveFeaturesImpl(
    Edition edition, const typename DescriptorT::Proto& proto,
    DescriptorT* descriptor, typename DescriptorT::OptionsType* options,
    internal::FlatAllocator& alloc,
    DescriptorPool::ErrorCollector::ErrorLocation error_location,
    bool force_merge) {
  const FeatureSet& parent_features = GetParentFeatures(descriptor);
  descriptor->proto_features_ = &FeatureSet::default_instance();
  descriptor->merged_features_ = &FeatureSet::default_instance();

  ABSL_CHECK(feature_resolver_.has_value());

  if (options->has_features()) {
    // Remove the features from the child's options proto to avoid leaking
    // internal details.
    descriptor->proto_features_ =
        tables_->InternFeatureSet(std::move(*options->mutable_features()));
    options->clear_features();
  }

  FeatureSet base_features = *descriptor->proto_features_;

  // Handle feature inference from proto2/proto3.
  if (IsLegacyEdition(edition)) {
    if (descriptor->proto_features_ != &FeatureSet::default_instance()) {
      AddError(descriptor->name(), proto, error_location,
               "Features are only valid under editions.");
    }
  }
  InferLegacyProtoFeatures(proto, *options, edition, base_features);

  if (base_features.ByteSizeLong() == 0 && !force_merge) {
    // Nothing to merge, and we aren't forcing it.
    descriptor->merged_features_ = &parent_features;
    return;
  }

  // Calculate the merged features for this target.
  absl::StatusOr<FeatureSet> merged =
      feature_resolver_->MergeFeatures(parent_features, base_features);
  if (!merged.ok()) {
    AddError(descriptor->name(), proto, error_location,
             [&] { return std::string(merged.status().message()); });
    return;
  }

  descriptor->merged_features_ = tables_->InternFeatureSet(*std::move(merged));
}